

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::Det
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *pTVar1;
  int i;
  long lVar2;
  value_type vVar3;
  value_type vVar4;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_108;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_f8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_e8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_d8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_c8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_b8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_a8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_98;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_88;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_78;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_68;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_58;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_48;
  TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
  local_38;
  TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
  local_28;
  
  local_f8.fadexpr_.left_ = &local_108;
  local_f8.fadexpr_.right_ = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_c8.fadexpr_.right_ = local_f8.fadexpr_.right_ + 3;
  local_68.fadexpr_.left_ = &local_78;
  local_d8.fadexpr_.right_ = local_f8.fadexpr_.right_ + 5;
  local_58.fadexpr_.left_ = &local_68;
  local_e8.fadexpr_.left_ = local_f8.fadexpr_.right_ + 1;
  local_c8.fadexpr_.left_ = local_f8.fadexpr_.right_ + 2;
  local_98.fadexpr_.left_ = &local_a8;
  local_108.fadexpr_.left_ = local_f8.fadexpr_.right_ + 4;
  local_88.fadexpr_.left_ = &local_98;
  local_58.fadexpr_.right_ = &local_88;
  local_88.fadexpr_.right_.constant_ = 2.0;
  local_48.fadexpr_.left_ = &local_58;
  local_b8.fadexpr_.left_ = &local_c8;
  local_48.fadexpr_.right_ = &local_b8;
  local_38.left_ = &local_48;
  local_d8.fadexpr_.left_ = &local_e8;
  local_38.right_ = &local_d8;
  local_28.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
        *)&local_38;
  local_28.right_ = &local_f8;
  (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_108.fadexpr_.right_ = local_108.fadexpr_.left_;
  local_e8.fadexpr_.right_ = local_e8.fadexpr_.left_;
  local_b8.fadexpr_.right_ = local_c8.fadexpr_.left_;
  local_a8.fadexpr_.left_ = local_e8.fadexpr_.left_;
  local_a8.fadexpr_.right_ = local_c8.fadexpr_.left_;
  local_98.fadexpr_.right_ = local_108.fadexpr_.left_;
  local_78.fadexpr_.left_ = local_f8.fadexpr_.right_;
  local_78.fadexpr_.right_ = local_c8.fadexpr_.right_;
  local_68.fadexpr_.right_ = local_d8.fadexpr_.right_;
  vVar3 = TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
          ::val((TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
                 *)local_28.left_);
  pTVar1 = ((local_28.right_)->fadexpr_).left_;
  __return_storage_ptr__->val_ =
       vVar3 - ((pTVar1->fadexpr_).left_)->val_ * ((pTVar1->fadexpr_).right_)->val_ *
               (((local_28.right_)->fadexpr_).right_)->val_;
  lVar2 = 0;
  do {
    vVar4 = TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
            ::dx(&local_28,(int)lVar2);
    __return_storage_ptr__->dx_[lVar2] = vVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::Det() const {
    return fData[_XX_] * fData[_YY_] * fData[_ZZ_] + fData[_XY_] * fData[_XZ_] * fData[_YZ_]*2. - fData[_XZ_] * fData[_YY_] * fData[_XZ_] -
            fData[_XY_] * fData[_XY_] * fData[_ZZ_] - fData[_YZ_] * fData[_YZ_] * fData[_XX_];
}